

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,DirectoryTarget *dt,char *pass,bool check_all,
          bool check_relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer pTVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmGeneratorTarget *this_01;
  pointer pDVar4;
  char *pcVar5;
  bool bVar6;
  string *psVar7;
  cmLocalUnixMakefileGenerator3 *this_02;
  pointer pTVar8;
  ulong uVar9;
  undefined7 in_register_00000089;
  Dir *d;
  pointer pDVar10;
  char *pass_local;
  uint local_13c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string doc;
  cmAlphaNum local_e0;
  cmGlobalUnixMakefileGenerator3 *local_b0;
  DirectoryTarget *local_a8;
  string local_a0;
  cmAlphaNum local_80;
  string makeTarget;
  
  uVar9 = CONCAT71(in_register_00000089,check_all) & 0xffffffff;
  this_00 = (cmLocalUnixMakefileGenerator3 *)dt->LG;
  pass_local = pass;
  local_b0 = this;
  psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_00);
  local_80.View_._M_str = (psVar7->_M_dataplus)._M_p;
  local_80.View_._M_len = psVar7->_M_string_length;
  local_e0.View_._M_str = local_e0.Digits_;
  local_e0.View_._M_len = 1;
  local_e0.Digits_[0] = '/';
  cmStrCat<char_const*>(&makeTarget,&local_80,&local_e0,&pass_local);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar8 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_13c = (uint)CONCAT71(in_register_00000089,check_all);
  local_a8 = dt;
  do {
    if (pTVar8 == pTVar1) {
      pDVar4 = (local_a8->Children).
               super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar10 = (local_a8->Children).
                     super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar10 != pDVar4;
          pDVar10 = pDVar10 + 1) {
        if (((char)uVar9 == '\0') || (pDVar10->ExcludeFromAll == false)) {
          local_80.View_._M_str = (pDVar10->Path)._M_dataplus._M_p;
          local_80.View_._M_len = (pDVar10->Path)._M_string_length;
          local_e0.View_._M_len = 1;
          local_e0.View_._M_str = local_e0.Digits_;
          local_e0.Digits_[0] = '/';
          cmStrCat<char_const*>(&doc,&local_80,&local_e0,&pass_local);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                     &doc);
          std::__cxx11::string::~string((string *)&doc);
        }
      }
      if ((depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((local_b0->EmptyRuleHackDepends)._M_string_length != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&local_b0->EmptyRuleHackDepends);
      }
      doc._M_dataplus._M_p = (pointer)&doc.field_2;
      doc._M_string_length = 0;
      doc.field_2._M_local_buf[0] = '\0';
      bVar6 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this_00);
      pcVar5 = pass_local;
      if (bVar6) {
        local_80.View_._M_len = 0x14;
        local_80.View_._M_str = "The main recursive \"";
        local_e0.View_._M_len = strlen(pass_local);
        local_e0.View_._M_str = pcVar5;
        cmStrCat<char[10]>(&local_a0,&local_80,&local_e0,(char (*) [10])"\" target.");
      }
      else {
        local_80.View_._M_len = (size_t)&DAT_0000000b;
        local_80.View_._M_str = "Recursive \"";
        local_e0.View_._M_len = strlen(pass_local);
        local_e0.View_._M_str = pcVar5;
        cmStrCat<char[20]>(&local_a0,&local_80,&local_e0,(char (*) [20])"\" directory target.");
      }
      std::__cxx11::string::operator=((string *)&doc,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (rootLG,ruleFileStream,doc._M_dataplus._M_p,&makeTarget,&depends,commands,true,false
                );
      std::__cxx11::string::~string((string *)&doc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      std::__cxx11::string::~string((string *)&makeTarget);
      return;
    }
    if ((char)uVar9 == '\0') {
      if (check_relink) goto LAB_003fd264;
LAB_003fd2b1:
      this_02 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(pTVar8->GT);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                (&local_a0,this_02,pTVar8->GT);
      local_80.View_._M_len = local_a0._M_string_length;
      local_80.View_._M_str = local_a0._M_dataplus._M_p;
      local_e0.View_._M_len = 1;
      local_e0.View_._M_str = local_e0.Digits_;
      local_e0.Digits_[0] = '/';
      cmStrCat<char_const*>(&doc,&local_80,&local_e0,&pass_local);
      std::__cxx11::string::~string((string *)&local_a0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,&doc)
      ;
      std::__cxx11::string::~string((string *)&doc);
    }
    else {
      pbVar2 = (pTVar8->ExcludedFromAllInConfigs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (pTVar8->ExcludedFromAllInConfigs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar2 == pbVar3 && check_relink) {
LAB_003fd264:
        this_01 = pTVar8->GT;
        cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_((string *)&local_80,this_00);
        bVar6 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_01,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        uVar9 = (ulong)local_13c;
        if (bVar6) goto LAB_003fd2b1;
      }
      else if (pbVar2 == pbVar3) goto LAB_003fd2b1;
    }
    pTVar8 = pTVar8 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  DirectoryTarget const& dt, const char* pass, bool check_all,
  bool check_relink, std::vector<std::string> const& commands)
{
  auto* lg = static_cast<cmLocalUnixMakefileGenerator3*>(dt.LG);
  std::string makeTarget =
    cmStrCat(lg->GetCurrentBinaryDirectory(), '/', pass);

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  for (DirectoryTarget::Target const& t : dt.Targets) {
    // Add this to the list of depends rules in this directory.
    if ((!check_all || t.ExcludedFromAllInConfigs.empty()) &&
        (!check_relink ||
         t.GT->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
      // The target may be from a different directory; use its local gen.
      auto const* tlg = static_cast<cmLocalUnixMakefileGenerator3 const*>(
        t.GT->GetLocalGenerator());
      std::string tname =
        cmStrCat(tlg->GetRelativeTargetDirectory(t.GT), '/', pass);
      depends.push_back(std::move(tname));
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  for (DirectoryTarget::Dir const& d : dt.Children) {
    if (check_all && d.ExcludeFromAll) {
      continue;
    }
    std::string subdir = cmStrCat(d.Path, '/', pass);
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc;
  if (lg->IsRootMakefile()) {
    doc = cmStrCat("The main recursive \"", pass, "\" target.");
  } else {
    doc = cmStrCat("Recursive \"", pass, "\" directory target.");
  }

  rootLG.WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                       commands, true);
}